

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
Nfa::dfs_del_loop(Nfa *this,int now,int *_index,
                 stack<int,_std::deque<int,_std::allocator<int>_>_> *stk,
                 vector<int,_std::allocator<int>_> *dfn,vector<int,_std::allocator<int>_> *low,
                 vector<int,_std::allocator<int>_> *belong)

{
  Fa_Node *pFVar1;
  pointer piVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  int *piVar4;
  pointer ppFVar5;
  _Elt_pointer piVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  pointer pEVar10;
  size_type sVar11;
  bool bVar12;
  pointer pEVar13;
  reference rVar14;
  int local_54;
  vector<int,_std::allocator<int>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  pointer local_40;
  int *local_38;
  
  iVar9 = *_index;
  (dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[now]
       = iVar9;
  (low->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[now]
       = iVar9;
  *_index = *_index + 1;
  local_54 = now;
  local_50 = low;
  local_38 = _index;
  std::deque<int,_std::allocator<int>_>::push_back(&stk->c,&local_54);
  local_48 = &this->used;
  rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](local_48,(long)local_54);
  *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
  ppFVar5 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar10 = (ppFVar5[local_54]->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar13 = *(pointer *)
             ((long)&(ppFVar5[local_54]->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                     _M_impl + 8);
  local_40 = pEVar13;
  do {
    pvVar3 = local_50;
    if (pEVar10 == pEVar13) {
      if ((dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_54] ==
          (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_54]) {
        do {
          piVar6 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (piVar6 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur) {
            return;
          }
          if (piVar6 == (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) {
            piVar6 = (stk->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          iVar9 = piVar6[-1];
          sVar11 = (size_type)iVar9;
          std::deque<int,_std::allocator<int>_>::pop_back(&stk->c);
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](local_48,sVar11);
          *rVar14._M_p = *rVar14._M_p & ~rVar14._M_mask;
          (belong->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[sVar11] = local_54;
          ppFVar5 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pFVar1 = ppFVar5[local_54];
          bVar8 = true;
          bVar12 = true;
          if (pFVar1->start == false) {
            bVar12 = ppFVar5[sVar11]->start;
          }
          pFVar1->start = bVar12;
          if (pFVar1->end == false) {
            bVar8 = ppFVar5[sVar11]->end;
          }
          pFVar1->end = bVar8;
        } while (iVar9 != local_54);
      }
      return;
    }
    if (pEVar10->c == '\0') {
      pFVar1 = pEVar10->v;
      iVar9 = pFVar1->n;
      sVar11 = (size_type)iVar9;
      if (ppFVar5[local_54]->start == true) {
        ppFVar5[sVar11]->start = true;
      }
      if ((dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[sVar11] == 0) {
        dfs_del_loop(this,iVar9,local_38,stk,dfn,local_50,belong);
        piVar2 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = piVar2 + local_54;
        piVar7 = piVar2 + pFVar1->n;
        pEVar13 = local_40;
LAB_00103fba:
        iVar9 = *piVar4;
        if (*piVar7 < *piVar4) {
          iVar9 = *piVar7;
        }
        *piVar4 = iVar9;
      }
      else {
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](local_48,sVar11);
        if ((*rVar14._M_p & rVar14._M_mask) != 0) {
          piVar4 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + local_54;
          piVar7 = (dfn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + pFVar1->n;
          goto LAB_00103fba;
        }
      }
      ppFVar5 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppFVar5[pFVar1->n]->end == true) {
        ppFVar5[local_54]->end = true;
      }
    }
    pEVar10 = pEVar10 + 1;
  } while( true );
}

Assistant:

void
Nfa::dfs_del_loop(int now, int &_index, stack<int> &stk, vector<int> &dfn, vector<int> &low,
                  vector<int> &belong) {
    low[now] = dfn[now] = _index;
    _index++;
    stk.push(now);
    used[now] = true;
    for (auto i:Node[now]->edge) {
        if (i.c != '\0') {
            continue;
        }
        if (Node[now]->start) {
            Node[i.v->n]->start = true;
        }
        //start expand
        if (!dfn[i.v->n]) {
            dfs_del_loop(i.v->n, _index, stk, dfn, low, belong);
            low[now] = min(low[now], low[i.v->n]);
        } else if (used[i.v->n]) {
            low[now] = min(low[now], dfn[i.v->n]);
        }
        if (Node[i.v->n]->end) {
            Node[now]->end = true;
        }
        //end expand
    }
    if (dfn[now] == low[now]) {
        while (!stk.empty()) {
            int u = stk.top();
            stk.pop();
            used[u] = false;
            belong[u] = now;

            Node[now]->start = Node[now]->start || Node[u]->start;
            Node[now]->end = Node[now]->end || Node[u]->end;

            if (u == now) {
                break;
            }
        }
    }
}